

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O3

int __thiscall RenderTarget::init(RenderTarget *this,EVP_PKEY_CTX *ctx)

{
  GLuint GVar1;
  long *plVar2;
  size_type *psVar3;
  int number;
  nite *this_00;
  string local_68;
  string local_48;
  CreateProxy local_21 [8];
  CreateProxy renRTZoom;
  
  (*__glewGenFramebuffers)(1,&this->objectId);
  (*__glewBindFramebuffer)(0x8ca9,this->objectId);
  GVar1 = createTexture((int)(::size.x * targetExcess),(int)(targetExcess * ::size.y));
  this->texture = GVar1;
  (*__glewFramebufferTexture2D)(0x8d40,0x8ce0,0xde1,GVar1,0);
  this_00 = (nite *)(ulong)(uint)RTcount;
  RTcount = RTcount + 1;
  nite::toStr_abi_cxx11_(&local_68,this_00,number);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x2447c6);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_48.field_2._M_allocated_capacity = *psVar3;
    local_48.field_2._8_8_ = plVar2[3];
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = *psVar3;
    local_48._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_48._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  nite::Console::CreateProxy::CreateProxy(local_21,&local_48,1,4,&this->Zoom);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  (*__glewBindFramebuffer)(0x8d40,0);
  this->angle = 0.0;
  this->minZoom = 25.0;
  this->Zoom = 100.0;
  this->realZoom = 100.0;
  ::target = 0;
  this->smooth = true;
  return 0x42c80000;
}

Assistant:

void init(){
		/* Create framebuffer for the scene */
		glGenFramebuffers(1, &objectId);
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, objectId);
		/* Create texture and attach it to the framebuffer */
		texture = createTexture(size.x * targetExcess, size.y * targetExcess);
		/* Attach it to the freambuffer */
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture, 0);

		/* Get status */
		// GLenum Status;
		// Status = glCheckFramebufferStatusEXT(GL_FRAMEBUFFER_EXT);
		// if (Status != GL_FRAMEBUFFER_COMPLETE_EXT) Error = Status;
		/* Switch back to the window framebuffer */
		nite::Console::CreateProxy renRTZoom("ren_zoom"+nite::toStr(RTcount++), nite::Console::ProxyType::Float, sizeof(Zoom), &Zoom);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);
		minZoom = 25;
		angle 	= 0;
		Zoom 		= 100;
		realZoom= Zoom;
		target	= 0;
		smooth 	= true;
	}